

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgcmp.c
# Opt level: O0

jas_image_t * makediffimage(jas_matrix_t *origdata,jas_matrix_t *recondata)

{
  int iVar1;
  jas_matind_t jVar2;
  jas_matind_t jVar3;
  long lVar4;
  jas_seqent_t v;
  jas_seqent_t jVar5;
  long local_128;
  jas_matind_t k;
  jas_matind_t j;
  jas_matind_t height;
  jas_matind_t width;
  jas_seqent_t b;
  jas_seqent_t a;
  jas_image_cmptparm_t compparms [3];
  jas_matrix_t *pjStack_48;
  int i;
  jas_matrix_t *diffdata [3];
  jas_image_t *diffimage;
  jas_matrix_t *recondata_local;
  jas_matrix_t *origdata_local;
  
  jVar2 = jas_matrix_numcols(origdata);
  jVar3 = jas_matrix_numrows(origdata);
  for (compparms[2].sgnd = 0; compparms[2].sgnd < 3; compparms[2].sgnd = compparms[2].sgnd + 1) {
    compparms[(long)compparms[2].sgnd + -1].prec = 0;
    compparms[(long)compparms[2].sgnd + -1].sgnd = 0;
    compparms[compparms[2].sgnd].tlx = 0;
    compparms[compparms[2].sgnd].tly = 1;
    compparms[compparms[2].sgnd].hstep = 1;
    compparms[compparms[2].sgnd].vstep = jVar2;
    compparms[compparms[2].sgnd].width = jVar3;
    *(undefined4 *)&compparms[compparms[2].sgnd].height = 8;
    *(undefined4 *)((long)&compparms[compparms[2].sgnd].height + 4) = 0;
  }
  origdata_local = (jas_matrix_t *)jas_image_create(3,&a,0x401);
  if (origdata_local == (jas_matrix_t *)0x0) {
    fprintf(_stderr,"cannot create image\n");
LAB_00102f35:
    if (origdata_local != (jas_matrix_t *)0x0) {
      jas_image_destroy(origdata_local);
    }
    origdata_local = (jas_matrix_t *)0x0;
  }
  else {
    for (compparms[2].sgnd = 0; compparms[2].sgnd < 3; compparms[2].sgnd = compparms[2].sgnd + 1) {
      lVar4 = jas_matrix_create(jVar3,jVar2);
      *(long *)((long)&stack0xffffffffffffffb8 + (long)compparms[2].sgnd * 8) = lVar4;
      if (lVar4 == 0) {
        fprintf(_stderr,"cannot create matrix\n");
        goto LAB_00102f35;
      }
    }
    for (k = 0; k < jVar3; k = k + 1) {
      for (local_128 = 0; local_128 < jVar2; local_128 = local_128 + 1) {
        v = jas_matrix_get(origdata,k,local_128);
        jVar5 = jas_matrix_get(recondata,k,local_128);
        if (jVar5 < v) {
          jas_matrix_set(pjStack_48,k,local_128,0xff);
          jas_matrix_set(diffdata[0],k,local_128,0);
          jas_matrix_set(diffdata[1],k,local_128,0);
        }
        else if (v < jVar5) {
          jas_matrix_set(pjStack_48,k,local_128,0);
          jas_matrix_set(diffdata[0],k,local_128,0xff);
          jas_matrix_set(diffdata[1],k,local_128,0);
        }
        else {
          jas_matrix_set(pjStack_48,k,local_128,v);
          jas_matrix_set(diffdata[0],k,local_128,v);
          jas_matrix_set(diffdata[1],k,local_128,v);
        }
      }
    }
    for (compparms[2].sgnd = 0; compparms[2].sgnd < 3; compparms[2].sgnd = compparms[2].sgnd + 1) {
      iVar1 = jas_image_writecmpt(origdata_local,compparms[2].sgnd,0,0,jVar2,jVar3,
                                  *(undefined8 *)
                                   ((long)&stack0xffffffffffffffb8 + (long)compparms[2].sgnd * 8));
      if (iVar1 != 0) {
        fprintf(_stderr,"cannot write image component\n");
        goto LAB_00102f35;
      }
    }
  }
  return (jas_image_t *)origdata_local;
}

Assistant:

jas_image_t *makediffimage(jas_matrix_t *origdata, jas_matrix_t *recondata)
{
	jas_image_t *diffimage;
	jas_matrix_t *diffdata[3];
	int i;
	jas_image_cmptparm_t compparms[3];
	jas_seqent_t a;
	jas_seqent_t b;

	diffimage = 0;
	const jas_matind_t width = jas_matrix_numcols(origdata);
	const jas_matind_t height = jas_matrix_numrows(origdata);

	for (i = 0; i < 3; ++i) {
		compparms[i].tlx = 0;
		compparms[i].tly = 0;
		compparms[i].hstep = 1;
		compparms[i].vstep = 1;
		compparms[i].width = width;
		compparms[i].height = height;
		compparms[i].prec = 8;
		compparms[i].sgnd = false;
	}
	if (!(diffimage = jas_image_create(3, compparms, JAS_CLRSPC_SRGB))) {
		fprintf(stderr, "cannot create image\n");
		goto error;
	}

	for (i = 0; i < 3; ++i) {
		if (!(diffdata[i] = jas_matrix_create(height, width))) {
			fprintf(stderr, "cannot create matrix\n");
			goto error;
		}
	}

	for (jas_matind_t j = 0; j < height; ++j) {
		for (jas_matind_t k = 0; k < width; ++k) {
			a = jas_matrix_get(origdata, j, k);
			b = jas_matrix_get(recondata, j, k);
			if (a > b) {
				jas_matrix_set(diffdata[0], j, k, 255);
				jas_matrix_set(diffdata[1], j, k, 0);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else if (a < b) {
				jas_matrix_set(diffdata[0], j, k, 0);
				jas_matrix_set(diffdata[1], j, k, 255);
				jas_matrix_set(diffdata[2], j, k, 0);
			} else {
				jas_matrix_set(diffdata[0], j, k, a);
				jas_matrix_set(diffdata[1], j, k, a);
				jas_matrix_set(diffdata[2], j, k, a);
			}
		}
	}

	for (i = 0; i < 3; ++i) {
		if (jas_image_writecmpt(diffimage, i, 0, 0, width, height, diffdata[i])) {
			fprintf(stderr, "cannot write image component\n");
			goto error;
		}
	}

	return diffimage;

error:
	if (diffimage) {
		jas_image_destroy(diffimage);
	}
	return 0;
}